

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

ostream * covenant::operator<<
                    (ostream *o,
                    set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *s)

{
  bool bVar1;
  iterator this;
  reference puVar2;
  ostream *poVar3;
  ostream *in_RDI;
  iterator et;
  iterator it;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffd8;
  _Self local_18 [2];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::operator<<(in_RDI,"{");
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffffd8);
  this = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::operator!=(local_18,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    poVar3 = local_8;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x201205);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar2);
    std::operator<<(poVar3,";");
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)this._M_node);
  }
  std::operator<<(local_8,"}");
  return local_8;
}

Assistant:

inline ostream& operator<<(ostream& o, const set<T> &s) {
    o << "{";
    for(typename set<T>::iterator it= s.begin(), et= s.end(); it!=et; ++it)
      o << *it << ";" ;
    o << "}";
    return o;
  }